

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O0

bool trompeloeil::trace_return<bool,CATCH2_INTERNAL_TEST_8()::__4,std::tuple<int&>,void>
               (trace_agent *agent,anon_class_1_0_00000001_for_func *func,tuple<int_&> *params)

{
  bool bVar1;
  bool local_21;
  tuple<int_&> *local_20;
  tuple<int_&> *params_local;
  anon_class_1_0_00000001_for_func *func_local;
  trace_agent *agent_local;
  
  local_20 = params;
  params_local = (tuple<int_&> *)func;
  func_local = (anon_class_1_0_00000001_for_func *)agent;
  local_21 = CATCH2_INTERNAL_TEST_8()::$_4::operator()((__4 *)func,params);
  bVar1 = trace_agent::trace_return<bool>(agent,&local_21);
  return bVar1;
}

Assistant:

Ret
  trace_return(
    trace_agent& agent,
    F& func,
    P& params)
  {
    /* Work around VS 2017 15.7.x C4702 warning by
     * enclosing the operation in an otherwise
     * unnecessary try/catch block.
     */
    try
    {
      return agent.trace_return(func(params));
    }
    catch (...)
    {
      throw;
    }
  }